

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  pointer pbVar1;
  ulong uVar2;
  bool bVar3;
  
  if (at == 0) {
    __assert_fail("at > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h"
                  ,0x2146,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const")
    ;
  }
  pbVar1 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(size_type *)((long)(pbVar1 + this->m_stringIndex) + 8);
  if (at <= uVar2) {
    if (uVar2 != at) {
      bVar3 = isWhitespace(*(char *)(*(long *)&pbVar1[this->m_stringIndex]._M_dataplus + at));
      if ((bVar3) &&
         (bVar3 = isWhitespace(*(char *)(*(long *)&(this->m_column->m_strings).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [this->m_stringIndex]._M_dataplus + -1 + at)),
         !bVar3)) {
        return true;
      }
      bVar3 = isBreakableBefore(*(char *)(*(long *)&(this->m_column->m_strings).
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [this->m_stringIndex]._M_dataplus + at));
      if (!bVar3) {
        bVar3 = isBreakableAfter(*(char *)(*(long *)&(this->m_column->m_strings).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [this->m_stringIndex]._M_dataplus + -1 + at));
        return bVar3;
      }
    }
    return true;
  }
  __assert_fail("at <= line().size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h"
                ,0x2147,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const");
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}